

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

SUNErrCode
SUNLogger_QueueMsg(SUNLogger logger,SUNLogLevel lvl,char *scope,char *label,char *msg_txt,...)

{
  char in_AL;
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  SUNLogLevel in_ESI;
  SUNLogger in_RDI;
  char *in_R8;
  char *in_R9;
  char *in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  char **in_XMM1_Qb;
  char *log_msg;
  int rank;
  va_list args;
  SUNErrCode retval;
  undefined1 local_118 [24];
  __va_list_tag *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  char **in_stack_ffffffffffffff30;
  int local_5c [3];
  undefined1 *local_50;
  undefined1 *local_48;
  SUNErrCode local_34;
  char *local_30;
  char *local_28;
  char *local_20;
  SUNLogLevel local_14;
  SUNLogger local_10;
  SUNErrCode local_4;
  
  if (in_AL != '\0') {
    in_stack_ffffffffffffff18 = in_XMM0_Qa;
    in_stack_ffffffffffffff20 = in_XMM0_Qb;
    in_stack_ffffffffffffff30 = in_XMM1_Qb;
  }
  local_34 = 0;
  if (in_RDI == (SUNLogger)0x0) {
    local_4 = -9999;
  }
  else {
    local_48 = local_118;
    local_50 = &stack0x00000008;
    local_5c[2] = 0x30;
    local_5c[1] = 0x28;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    local_10 = in_RDI;
    if (in_RDI->queuemsg ==
        (_func_SUNErrCode_SUNLogger_SUNLogLevel_char_ptr_char_ptr_char_ptr___va_list_tag_ptr *)0x0)
    {
      local_5c[0] = 0;
      iVar1 = sunLoggerIsOutputRank(in_RDI,local_5c);
      if (iVar1 != 0) {
        sunCreateLogMessage((SUNLogLevel)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                            (int)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_R9,
                            in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                            in_stack_ffffffffffffff30);
        switch(local_14) {
        case SUN_LOGLEVEL_ERROR:
          if (local_10->error_fp != (FILE *)0x0) {
            fprintf((FILE *)local_10->error_fp,"%s",0);
          }
          break;
        case SUN_LOGLEVEL_WARNING:
          if (local_10->warning_fp != (FILE *)0x0) {
            fprintf((FILE *)local_10->warning_fp,"%s",0);
          }
          break;
        case SUN_LOGLEVEL_INFO:
          if (local_10->info_fp != (FILE *)0x0) {
            fprintf((FILE *)local_10->info_fp,"%s",0);
          }
          break;
        case SUN_LOGLEVEL_DEBUG:
          if (local_10->debug_fp != (FILE *)0x0) {
            fprintf((FILE *)local_10->debug_fp,"%s",0);
          }
          break;
        default:
          local_34 = -0x26f8;
        }
        free((void *)0x0);
      }
    }
    else {
      local_34 = (*in_RDI->queuemsg)(in_RDI,in_ESI,in_RDX,in_RCX,in_R8,
                                     (__va_list_tag *)(local_5c + 1));
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

SUNErrCode SUNLogger_QueueMsg(SUNLogger logger, SUNLogLevel lvl,
                              const char* scope, const char* label,
                              const char* msg_txt, ...)
{
  SUNErrCode retval = SUN_SUCCESS;

#if SUNDIALS_LOGGING_LEVEL > 0
  {
    if (!logger)
    {
      retval = SUN_ERR_ARG_CORRUPT;
      return retval;
    }

    va_list args;
    va_start(args, msg_txt);

    if (logger->queuemsg)
    {
      retval = logger->queuemsg(logger, lvl, scope, label, msg_txt, args);
    }
    else
    {
      /* Default implementation */
      int rank = 0;
      if (sunLoggerIsOutputRank(logger, &rank))
      {
        char* log_msg = NULL;
        sunCreateLogMessage(lvl, rank, scope, label, msg_txt, args, &log_msg);

        switch (lvl)
        {
        case (SUN_LOGLEVEL_DEBUG):
          if (logger->debug_fp) { fprintf(logger->debug_fp, "%s", log_msg); }
          break;
        case (SUN_LOGLEVEL_WARNING):
          if (logger->warning_fp)
          {
            fprintf(logger->warning_fp, "%s", log_msg);
          }
          break;
        case (SUN_LOGLEVEL_INFO):
          if (logger->info_fp) { fprintf(logger->info_fp, "%s", log_msg); }
          break;
        case (SUN_LOGLEVEL_ERROR):
          if (logger->error_fp) { fprintf(logger->error_fp, "%s", log_msg); }
          break;
        default: retval = SUN_ERR_UNREACHABLE;
        }

        free(log_msg);
      }
    }

    va_end(args);
  }
#else
  /* silence warnings when all logging is disabled */
  ((void)logger);
  ((void)lvl);
  ((void)scope);
  ((void)label);
  ((void)msg_txt);
#endif

  return retval;
}